

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprCodeIsNullJump(Vdbe *v,Expr *pExpr,int iReg,int iDest)

{
  byte bVar1;
  
  while (bVar1 = pExpr->op, bVar1 - 0x9c < 2) {
    pExpr = pExpr->pLeft;
  }
  if (bVar1 == 0x84) {
    bVar1 = pExpr->op2;
  }
  if ((bVar1 - 0x5e < 0x26) && ((0x3800000001U >> ((ulong)(bVar1 - 0x5e) & 0x3f) & 1) != 0)) {
    return;
  }
  sqlite3VdbeAddOp3(v,0x49,iReg,iDest,0);
  return;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCanBeNull(const Expr *p){
  u8 op;
  while( p->op==TK_UPLUS || p->op==TK_UMINUS ){ p = p->pLeft; }
  op = p->op;
  if( op==TK_REGISTER ) op = p->op2;
  switch( op ){
    case TK_INTEGER:
    case TK_STRING:
    case TK_FLOAT:
    case TK_BLOB:
      return 0;
    default:
      return 1;
  }
}